

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptParser.cpp
# Opt level: O0

Value __thiscall
MiniScript::Parser::ParseExpr(Parser *this,Lexer *tokens,bool asLval,bool statementStart)

{
  undefined7 in_register_00000011;
  anon_union_8_3_2f476f46_for_data extraout_RDX;
  byte in_R8B;
  Value VVar1;
  Lexer local_40;
  code *local_38;
  offset_in_Parser_to_subr nextLevel;
  byte local_22;
  byte local_21;
  bool statementStart_local;
  Lexer *pLStack_20;
  bool asLval_local;
  Lexer *tokens_local;
  Parser *this_local;
  
  pLStack_20 = (Lexer *)CONCAT71(in_register_00000011,asLval);
  local_22 = in_R8B & 1;
  local_38 = ParseFunction;
  nextLevel = 0;
  local_21 = statementStart;
  tokens_local = tokens;
  this_local = this;
  Lexer::Lexer(&local_40,pLStack_20);
  ParseFunction(this,tokens,SUB81(&local_40,0),(bool)(local_21 & 1));
  Lexer::~Lexer(&local_40);
  VVar1.data.number = extraout_RDX.number;
  VVar1._0_8_ = this;
  return VVar1;
}

Assistant:

Value Parser::ParseExpr(Lexer tokens, bool asLval, bool statementStart) {
		Value (Parser::*nextLevel)(Lexer tokens, bool asLval, bool statementStart) = &Parser::ParseFunction;
		return (*this.*nextLevel)(tokens, asLval, statementStart);
	}